

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle.cpp
# Opt level: O0

void __thiscall PP_particle::PP_particle(PP_particle *this,PP_particle *p)

{
  PP_COORD local_58;
  PP_COORD local_30;
  PP_particle *local_18;
  PP_particle *p_local;
  PP_particle *this_local;
  
  local_18 = p;
  p_local = this;
  PP_object::PP_object(&this->super_PP_object);
  (this->super_PP_object)._vptr_PP_object = (_func_int **)&PTR_force_00125d08;
  PP_COORD::operator=(&local_30,&(this->super_PP_object).coord,&(local_18->super_PP_object).coord);
  PP_COORD::~PP_COORD(&local_30);
  PP_COORD::operator=(&local_58,&(this->super_PP_object).v,&(local_18->super_PP_object).v);
  PP_COORD::~PP_COORD(&local_58);
  (this->super_PP_object).R = (local_18->super_PP_object).R;
  this->m = local_18->m;
  this->e = local_18->e;
  return;
}

Assistant:

PP_particle::PP_particle(PP_particle &p)
{
    coord=p.coord;
    v=p.v;
    R=p.R;
    m=p.m;
    e=p.e;
}